

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLReaderTest_ReadBoundsFirst_Test::TestBody(NLReaderTest_ReadBoundsFirst_Test *this)

{
  MockSpec<void_(const_mp::NLHeader_&)> *this_00;
  MockSpec<void_(int,_double,_double)> *this_01;
  MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *this_02;
  int in_R9D;
  NLStringRef str;
  InSequence dummy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  string local_480;
  NLHeader header;
  NiceMock<MockNLHandler> handler;
  
  testing::NiceMock<MockNLHandler>::NiceMock(&handler);
  testing::InSequence::InSequence(&dummy);
  testing::A<mp::NLHeader_const&>();
  this_00 = MockNLHandler::gmock_OnHeader
                      (&handler.super_MockNLHandler,(Matcher<const_mp::NLHeader_&> *)&header);
  testing::internal::MockSpec<void_(const_mp::NLHeader_&)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ec,"handler","OnHeader(_)");
  testing::internal::MatcherBase<const_mp::NLHeader_&>::~MatcherBase
            ((MatcherBase<const_mp::NLHeader_&> *)&header);
  testing::Matcher<int>::Matcher((Matcher<int> *)&header,0);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_4a0,1.0);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_480,2.0);
  this_01 = MockNLHandler::gmock_OnVarBounds
                      (&handler.super_MockNLHandler,(Matcher<int> *)&header,
                       (Matcher<double> *)&local_4a0,(Matcher<double> *)&local_480);
  testing::internal::MockSpec<void_(int,_double,_double)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ed,"handler","OnVarBounds(0, 1, 2)");
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_480);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_4a0);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&header);
  testing::A<int>();
  testing::A<mp::obj::Type>();
  testing::A<BasicTestExpr<0>>();
  this_02 = MockNLHandler::gmock_OnObj
                      (&handler.super_MockNLHandler,(Matcher<int> *)&header,
                       (Matcher<mp::obj::Type> *)&local_4a0,(Matcher<BasicTestExpr<0>_> *)&local_480
                      );
  testing::internal::MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ee,"handler","OnObj(_, _, _)");
  testing::internal::MatcherBase<BasicTestExpr<0>_>::~MatcherBase
            ((MatcherBase<BasicTestExpr<0>_> *)&local_480);
  testing::internal::MatcherBase<mp::obj::Type>::~MatcherBase
            ((MatcherBase<mp::obj::Type> *)&local_4a0);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&header);
  memset(&header,0,0x110);
  mp::NLHeader::NLHeader(&header);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 1;
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_objs =
       header.super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
  FormatHeader_abi_cxx11_(&local_480,&header,false);
  std::operator+(&local_4a0,&local_480,"O0 0\no2\nv0\nv0\nb\n0 1 2\n");
  str.size_ = (size_t)&handler;
  str.data_ = (char *)local_4a0._M_string_length;
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            ((mp *)local_4a0._M_dataplus._M_p,str,(NiceMock<MockNLHandler> *)0x22bdba,
             (CStringRef)0x1,in_R9D);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  testing::InSequence::~InSequence(&dummy);
  testing::NiceMock<MockNLHandler>::~NiceMock(&handler);
  return;
}

Assistant:

TEST(NLReaderTest, ReadBoundsFirst) {
  testing::NiceMock<MockNLHandler> handler;
  testing::InSequence dummy;
  EXPECT_CALL(handler, OnHeader(_));
  EXPECT_CALL(handler, OnVarBounds(0, 1, 2));
  EXPECT_CALL(handler, OnObj(_, _, _));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header, false) + "O0 0\no2\nv0\nv0\nb\n0 1 2\n",
               handler, "", mp::READ_BOUNDS_FIRST);
}